

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::NewArrayExpression>
          (ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *this,
          NewArrayExpression *t)

{
  bool bVar1;
  Expression *in_RSI;
  NewArrayExpression *in_RDI;
  
  bVar1 = Expression::bad(in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::NewArrayExpression>
              ((ASTVisitor<only_assigned_on_reset::MainVisitor,_true,_true,_false,_false> *)in_RSI,
               in_RDI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }